

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O3

psa_status_t psa_close_key(psa_key_handle_t handle)

{
  psa_status_t pVar1;
  undefined6 in_register_0000003a;
  
  if ((int)CONCAT62(in_register_0000003a,handle) == 0) {
    return 0;
  }
  pVar1 = -0x89;
  if ((((global_data._1536_1_ & 1) != 0) && (pVar1 = -0x88, 0xffdf < (ushort)(handle - 0x21))) &&
     (global_data.key_slots[handle - 1].attr.type != 0)) {
    pVar1 = psa_wipe_key_slot(global_data.key_slots + (handle - 1));
    return pVar1;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_close_key( psa_key_handle_t handle )
{
    psa_status_t status;
    psa_key_slot_t *slot;

    if( handle == 0 )
        return( PSA_SUCCESS );

    status = psa_get_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    return( psa_wipe_key_slot( slot ) );
}